

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O1

Var Js::JavascriptArray::SortHelper<Memory::WriteBarrierPtr<void>>
              (Var array,CompareVarsInfo *cvInfo)

{
  char *addr;
  ScriptContext *scriptContext;
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  Type TVar4;
  Var pvVar5;
  undefined4 *puVar6;
  TempArenaAllocatorObject *tempAllocator;
  RecyclableObject *this;
  JavascriptArray *pJVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  size_t requestedBytes;
  ulong uVar11;
  uint32 uVar12;
  Var local_78;
  Var item;
  undefined1 local_68 [8];
  JsReentLock jsReentLock;
  uint local_3c;
  RecyclableObject *local_38;
  RecyclableObject *obj;
  
  scriptContext = cvInfo->scriptContext;
  local_68 = (undefined1  [8])scriptContext->threadContext;
  jsReentLock.m_threadContext = (ThreadContext *)0x0;
  jsReentLock.m_arrayObject = (Var)0x0;
  jsReentLock.m_arrayObject2._0_1_ = ((ThreadContext *)local_68)->noJsReentrancy;
  ((ThreadContext *)local_68)->noJsReentrancy = true;
  JsReentLock::setObjectForMutation((JsReentLock *)local_68,array);
  local_38 = (RecyclableObject *)0x0;
  BVar3 = JavascriptConversion::ToObject(array,scriptContext,&local_38);
  if (BVar3 == 0) {
    JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec42,L"Array.prototype.sort");
  }
  *(undefined1 *)((long)local_68 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
  pvVar5 = JavascriptOperators::OP_GetLength(local_38,scriptContext);
  if (((ulong)pvVar5 & 0x1ffff00000000) != 0x1000000000000 &&
      ((ulong)pvVar5 & 0xffff000000000000) == 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar2) goto LAB_00ba0441;
    *puVar6 = 0;
  }
  if (((ulong)pvVar5 & 0xffff000000000000) == 0x1000000000000) {
    if (((ulong)pvVar5 & 0x1ffff00000000) != 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar2) goto LAB_00ba0441;
      *puVar6 = 0;
    }
  }
  else {
    uVar12 = JavascriptConversion::ToUInt32_Full(pvVar5,scriptContext);
    pvVar5 = (Var)(ulong)uVar12;
  }
  JsReentLock::MutateArrayObject((JsReentLock *)local_68);
  *(bool *)((long)local_68 + 0x108) = true;
  iVar9 = (int)pvVar5;
  if (iVar9 == 0) goto LAB_00ba0421;
  tempAllocator = ScriptContext::GetTemporaryAllocator(scriptContext,L"Runtime");
  BVar3 = ExceptionCheck::CanHandleOutOfMemory();
  if (BVar3 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                "ExceptionCheck::CanHandleOutOfMemory()");
    if (!bVar2) goto LAB_00ba0441;
    *puVar6 = 0;
  }
  requestedBytes = ((ulong)pvVar5 & 0xffffffff) << 3;
  item = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::AllocInternal
                   (&(tempAllocator->allocator).
                     super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>,
                    requestedBytes);
  if ((char *)item == (char *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
    if (!bVar2) {
LAB_00ba0441:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar6 = 0;
  }
  uVar12 = 0;
  memset(item,0,requestedBytes);
  jsReentLock._24_8_ = __tls_get_addr(&PTR_0155fe48);
  iVar8 = 0;
  iVar10 = 0;
  local_3c = 0;
LAB_00ba0007:
  *(undefined1 *)((long)local_68 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
  BVar3 = JavascriptOperators::HasItem(local_38,uVar12);
  JsReentLock::MutateArrayObject((JsReentLock *)local_68);
  *(bool *)((long)local_68 + 0x108) = true;
  if (BVar3 == 0) {
LAB_00ba0264:
    iVar8 = iVar8 + 1;
    goto LAB_00ba0270;
  }
  local_78 = (Var)0x0;
  *(undefined1 *)((long)local_68 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
  BVar3 = JavascriptOperators::GetItem(local_38,uVar12,&local_78,scriptContext);
  JsReentLock::MutateArrayObject((JsReentLock *)local_68);
  pvVar5 = local_78;
  *(bool *)((long)local_68 + 0x108) = true;
  if (BVar3 == 0) goto LAB_00ba0264;
  if (local_78 == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    *(undefined4 *)jsReentLock._24_8_ = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar2) goto LAB_00ba0441;
    *(undefined4 *)jsReentLock._24_8_ = 0;
  }
  if (((ulong)pvVar5 & 0x1ffff00000000) != 0x1000000000000 &&
      ((ulong)pvVar5 & 0xffff000000000000) == 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    *(undefined4 *)jsReentLock._24_8_ = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar2) goto LAB_00ba0441;
    *(undefined4 *)jsReentLock._24_8_ = 0;
  }
  if ((ulong)pvVar5 >> 0x32 == 0 && ((ulong)pvVar5 & 0xffff000000000000) != 0x1000000000000) {
    this = UnsafeVarTo<Js::RecyclableObject>(pvVar5);
    if (this == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *(undefined4 *)jsReentLock._24_8_ = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar2) goto LAB_00ba0441;
      *(undefined4 *)jsReentLock._24_8_ = 0;
    }
    TVar4 = ((this->type).ptr)->typeId;
    if (0x57 < (int)TVar4) {
      BVar3 = RecyclableObject::IsExternal(this);
      if (BVar3 != 0) goto LAB_00ba0234;
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *(undefined4 *)jsReentLock._24_8_ = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                  "GetTypeId aValue has invalid TypeId");
      if (!bVar2) goto LAB_00ba0441;
      *(undefined4 *)jsReentLock._24_8_ = 0;
      goto LAB_00ba0234;
    }
  }
  else {
LAB_00ba0234:
    TVar4 = TypeIds_FirstNumberType;
  }
  pvVar5 = local_78;
  if (TVar4 == TypeIds_Undefined) {
    iVar10 = iVar10 + 1;
  }
  else {
    addr = (char *)((long)item + (ulong)local_3c * 8);
    Memory::Recycler::WBSetBit(addr);
    *(Var *)addr = pvVar5;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
    local_3c = local_3c + 1;
  }
LAB_00ba0270:
  uVar12 = uVar12 + 1;
  if (iVar9 + (uint)(iVar9 == 0) == uVar12) goto code_r0x00ba0280;
  goto LAB_00ba0007;
code_r0x00ba0280:
  *(undefined1 *)((long)local_68 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
  if (local_3c < 0x200) {
    InsertionSort<Memory::WriteBarrierPtr<void>>((WriteBarrierPtr<void> *)item,local_3c,cvInfo);
    JsReentLock::MutateArrayObject((JsReentLock *)local_68);
  }
  else {
    MergeSort<Memory::WriteBarrierPtr<void>>
              ((WriteBarrierPtr<void> *)item,local_3c,cvInfo,&tempAllocator->allocator);
    JsReentLock::MutateArrayObject((JsReentLock *)local_68);
  }
  *(bool *)((long)local_68 + 0x108) = true;
  if (local_3c == 0) {
    uVar11 = 0;
  }
  else {
    uVar11 = 0;
    do {
      *(undefined1 *)((long)local_68 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
      JavascriptOperators::SetItem
                (local_38,local_38,(uint32)uVar11,*(Var *)((long)item + uVar11 * 8),scriptContext,
                 PropertyOperation_ThrowIfNonWritable|PropertyOperation_ThrowIfNotExtensible,0);
      JsReentLock::MutateArrayObject((JsReentLock *)local_68);
      *(bool *)((long)local_68 + 0x108) = true;
      uVar11 = uVar11 + 1;
    } while (local_3c != uVar11);
  }
  if (iVar10 != 0) {
    do {
      *(undefined1 *)((long)local_68 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
      JavascriptOperators::SetItem
                (local_38,local_38,(uint32)uVar11,
                 (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
                 super_JavascriptLibraryBase).undefinedValue.ptr,scriptContext,
                 PropertyOperation_ThrowIfNonWritable|PropertyOperation_ThrowIfNotExtensible,0);
      JsReentLock::MutateArrayObject((JsReentLock *)local_68);
      *(bool *)((long)local_68 + 0x108) = true;
      uVar11 = (ulong)((uint32)uVar11 + 1);
      iVar10 = iVar10 + -1;
    } while (iVar10 != 0);
  }
  if (iVar8 != 0) {
    do {
      *(undefined1 *)((long)local_68 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
      JavascriptOperators::DeleteItem
                (local_38,(uint32)uVar11,PropertyOperation_ThrowOnDeleteIfNotConfig);
      JsReentLock::MutateArrayObject((JsReentLock *)local_68);
      *(bool *)((long)local_68 + 0x108) = true;
      uVar11 = (ulong)((uint32)uVar11 + 1);
      iVar8 = iVar8 + -1;
    } while (iVar8 != 0);
  }
  ScriptContext::ReleaseTemporaryAllocator(scriptContext,tempAllocator);
  bVar2 = DynamicObject::IsAnyArray(local_38);
  if (bVar2) {
    pJVar7 = UnsafeVarTo<Js::JavascriptArray,Js::RecyclableObject>(local_38);
    ClearSegmentMap(pJVar7);
    pJVar7 = UnsafeVarTo<Js::JavascriptArray,Js::RecyclableObject>(local_38);
    (*(pJVar7->super_ArrayObject).super_DynamicObject.super_RecyclableObject.super_FinalizableObject
      .super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x74])(pJVar7);
  }
LAB_00ba0421:
  *(undefined1 *)((long)local_68 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
  return local_38;
}

Assistant:

Var JavascriptArray::SortHelper(Var array, JavascriptArray::CompareVarsInfo* cvInfo)
    {
        ScriptContext* scriptContext = cvInfo->scriptContext;
        
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        SETOBJECT_FOR_MUTATION(jsReentLock, array);

        // Per spec, throw if the 'this' value is not a valid object
        RecyclableObject* obj = nullptr;
        if (FALSE == JavascriptConversion::ToObject(array, scriptContext, &obj))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NullOrUndefined, _u("Array.prototype.sort"));
        }

        // Get the Length
        JS_REENTRANT(jsReentLock,
            uint32 len = JavascriptConversion::ToUInt32(JavascriptOperators::OP_GetLength(obj, scriptContext), scriptContext));

        // Early return if length = 0
        // Note cannot return early for length = 1 without further checks
        // As per spec we must use HasItem() and GetItem() on each element
        if (len == 0)
        {
            return obj;
        }

        BEGIN_TEMP_ALLOCATOR(tempAlloc, scriptContext, _u("Runtime"))
        {
            // Spec mandates that we copy the array into a 'list' before sorting
            // This severely limits the potential for sort side-effects to alter the result
            T* list = AnewArray(tempAlloc, T, len);

            uint32 values = 0;
            uint32 undefinedValues = 0;
            uint32 holes = 0;
            uint32 i = 0, j = 0;

            for (; i < len; ++i)
            {
                JS_REENTRANT(jsReentLock, BOOL hasItem = JavascriptOperators::HasItem(obj, i));
                
                if (hasItem)
                {
                    Var item = nullptr;
                    JS_REENTRANT(jsReentLock, BOOL gotItem = JavascriptOperators::GetItem(obj, i, &item, scriptContext));
                    if (gotItem)
                    {
                        TypeId type = JavascriptOperators::GetTypeId(item);
                        if (type != TypeIds_Undefined)
                        {
                            // If T = Var this adds item to the list
                            // If T = StringItem this creates a StringItem from the Var and adds that to the list
                            SortSetHelper(list, item, values, &jsReentLock, scriptContext);
                            values++;
                        }
                        else
                        {
                            ++undefinedValues;
                        }
                    }
                    else
                    {
                        ++holes;
                    }
                }
                else
                {
                    ++holes;
                }
            }

            // Call the appropriate Sorting Algorithm
            // Insertion sort uses less memory and is quicker on short arrays but gets less efficient as arrays get longer
            if (values < 512)
            {
                JS_REENTRANT(jsReentLock, JavascriptArray::InsertionSort<T>(list, values, cvInfo));
            }
            else
            {
                JS_REENTRANT(jsReentLock, JavascriptArray::MergeSort<T>(list, values, cvInfo, tempAlloc));
            }

            // Write the sorted data back to the original array
            // Undefined values and holes are placed at the end
            for (i = 0; i < values; ++i)
            {
                JS_REENTRANT(jsReentLock, JavascriptOperators::SetItem(obj, obj, i, SortGetHelper(list, i), scriptContext, static_cast<PropertyOperationFlags>(PropertyOperation_ThrowIfNonWritable | PropertyOperation_ThrowIfNotExtensible)));
            }
            for (; j < undefinedValues; ++j, ++i)
            {
                JS_REENTRANT(jsReentLock, JavascriptOperators::SetItem(obj, obj, i, scriptContext->GetLibrary()->GetUndefined(), scriptContext, static_cast<PropertyOperationFlags>(PropertyOperation_ThrowIfNonWritable | PropertyOperation_ThrowIfNotExtensible)));
            }
            for (j = 0; j < holes; ++j, ++i)
            {
                JS_REENTRANT(jsReentLock, JavascriptOperators::DeleteItem(obj, i, PropertyOperation_ThrowOnDeleteIfNotConfig));
            }
        }
        END_TEMP_ALLOCATOR(tempAlloc, scriptContext);

        // if the Array is not just an array-like object but an actual array we clear the Segment map
        // optimised access CC generates for arrays that may have been mangled by sorting
        if (VarIs<JavascriptArray>(obj))
        {
            UnsafeVarTo<JavascriptArray>(obj)->ClearSegmentMap();
            #ifdef VALIDATE_ARRAY
            UnsafeVarTo<JavascriptArray>(obj)->ValidateArray();
            #endif
        }

        return obj;
    }